

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O1

int doctest::detail::callTestFunc(funcType f)

{
  (*f)();
  return (int)(getContextState::data->numFailedAssertionsForCurrentTestcase != 0);
}

Assistant:

int callTestFunc(funcType f) {
        int res = EXIT_SUCCESS;
        try {
            f();
            if(getContextState()->numFailedAssertionsForCurrentTestcase)
                res = EXIT_FAILURE;
        } catch(const TestFailureException&) { res = EXIT_FAILURE; } catch(...) {
            DOCTEST_LOG_START();
            logTestCrashed();
            res = EXIT_FAILURE;
        }
        return res;
    }